

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void setpause(global_State *g)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long local_38;
  l_mem estimate;
  l_mem debt;
  l_mem threshold;
  global_State *g_local;
  
  uVar2 = g->GCestimate / 100;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  if ((long)g->gcpause <
      SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar2),0)) {
    local_38 = uVar2 * (long)g->gcpause;
  }
  else {
    local_38 = 0x7fffffffffffffff;
  }
  luaE_setdebt(g,(g->totalbytes + g->GCdebt) - local_38);
  return;
}

Assistant:

static void setpause (global_State *g) {
  l_mem threshold, debt;
  l_mem estimate = g->GCestimate / PAUSEADJ;  /* adjust 'estimate' */
  lua_assert(estimate > 0);
  threshold = (g->gcpause < MAX_LMEM / estimate)  /* overflow? */
            ? estimate * g->gcpause  /* no overflow */
            : MAX_LMEM;  /* overflow; truncate to maximum */
  debt = gettotalbytes(g) - threshold;
  luaE_setdebt(g, debt);
}